

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_celsius.cc
# Opt level: O1

bool __thiscall hwtest::pgraph::MthdCelsiusLightEnable::is_valid_val(MthdCelsiusLightEnable *this)

{
  ulong uVar1;
  byte bVar2;
  ulong uVar3;
  byte bVar4;
  ulong uVar5;
  
  uVar1 = (ulong)(this->super_SingleMthdTest).super_MthdTest.val;
  if (uVar1 < 0x10000) {
    uVar3 = 0xffffffffffffffff;
    bVar2 = 0x3e;
    bVar4 = 0;
    while (uVar5 = uVar1 << (bVar2 & 0x3f), !(bool)(bVar4 & 0x3fffffffffffffff < uVar5)) {
      if (uVar5 < 0x4000000000000000) {
        bVar4 = 1;
      }
      uVar3 = uVar3 + 1;
      bVar2 = bVar2 - 2;
      if (uVar3 == 7) {
        return 6 < uVar3;
      }
    }
  }
  return false;
}

Assistant:

bool is_valid_val() override {
		if (val & ~0xffff)
			return false;
		bool off = false;
		for (int i = 0; i < 8; i++) {
			int mode = extr(val, i * 2, 2);
			if (off && mode != 0)
				return false;
			if (mode == 0)
				off = true;
		}
		return true;
	}